

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

string * __thiscall
nlohmann::json_abi_v3_11_2::detail::
parser<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
::exception_message(string *__return_storage_ptr__,
                   parser<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
                   *this,token_type expected,string *context)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_R8;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_69;
  char *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  args_1 = context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"syntax error ",
             (allocator<char> *)((long)&local_69._M_dataplus._M_p + 1));
  if (context->_M_string_length != 0) {
    args_1 = &local_40;
    local_40._M_dataplus._M_p._0_1_ = 0x20;
    concat<std::__cxx11::string,char_const(&)[15],std::__cxx11::string_const&,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&local_69._M_dataplus._M_p + 1),(detail *)"while parsing ",
               (char (*) [15])context,args_1,in_R8);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)((long)&local_69._M_dataplus._M_p + 1));
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (this->last_token == parse_error) {
    local_48 = (this->m_lexer).error_message;
    lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
    ::get_token_string(&local_40,&this->m_lexer);
    local_69._M_dataplus._M_p._0_1_ = 0x27;
    args_1 = &local_40;
    concat<std::__cxx11::string,char_const*,char_const(&)[15],std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&local_69._M_dataplus._M_p + 1),(detail *)&local_48,(char **)"; last read: \'"
               ,(char (*) [15])args_1,&local_69,in_R9);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)((long)&local_69._M_dataplus._M_p + 1));
    this_00 = &local_40;
  }
  else {
    local_40._M_dataplus._M_p =
         lexer_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::token_type_name(this->last_token);
    concat<std::__cxx11::string,char_const(&)[12],char_const*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&local_69._M_dataplus._M_p + 1),(detail *)"unexpected ",
               (char (*) [12])&local_40,(char **)args_1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&local_69._M_dataplus._M_p + 1);
  }
  std::__cxx11::string::~string((string *)this_00);
  if (expected != uninitialized) {
    local_40._M_dataplus._M_p =
         lexer_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::token_type_name(expected);
    concat<std::__cxx11::string,char_const(&)[12],char_const*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&local_69._M_dataplus._M_p + 1),(detail *)"; expected ",
               (char (*) [12])&local_40,(char **)args_1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)((long)&local_69._M_dataplus._M_p + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string exception_message(const token_type expected, const std::string& context)
    {
        std::string error_msg = "syntax error ";

        if (!context.empty())
        {
            error_msg += concat("while parsing ", context, ' ');
        }

        error_msg += "- ";

        if (last_token == token_type::parse_error)
        {
            error_msg += concat(m_lexer.get_error_message(), "; last read: '",
                                m_lexer.get_token_string(), '\'');
        }
        else
        {
            error_msg += concat("unexpected ", lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += concat("; expected ", lexer_t::token_type_name(expected));
        }

        return error_msg;
    }